

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

string * __thiscall
Json::Value::getComment_abi_cxx11_
          (string *__return_storage_ptr__,Value *this,CommentPlacement placement)

{
  char *__s;
  bool bVar1;
  allocator<char> local_2d [16];
  allocator<char> local_1d;
  CommentPlacement local_1c;
  Value *pVStack_18;
  CommentPlacement placement_local;
  Value *this_local;
  
  local_1c = placement;
  pVStack_18 = this;
  this_local = (Value *)__return_storage_ptr__;
  bVar1 = hasComment(this,placement);
  if (bVar1) {
    __s = this->comments_[local_1c].comment_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,&local_1d);
    std::allocator<char>::~allocator(&local_1d);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,anon_var_dwarf_5fb39 + 9,local_2d);
    std::allocator<char>::~allocator(local_2d);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string 
Value::getComment( CommentPlacement placement ) const
{
   if ( hasComment(placement) )
      return comments_[placement].comment_;
   return "";
}